

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O3

MPP_RET vepu541_h265_set_roi(void *dst_buf,void *src_buf,RK_S32 w,RK_S32 h)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = h + 0x3f >> 6;
  if (0 < (int)uVar1) {
    uVar3 = w + 0x3f >> 6;
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar6 = uVar4 >> 4;
        uVar7 = 0;
        do {
          uVar2 = 0;
          do {
            *(undefined2 *)((long)dst_buf + uVar2 * 2 + (ulong)((uint)uVar6 & 0xfffffff) * 0x20) =
                 *(undefined2 *)
                  ((long)src_buf +
                  (ulong)((((uint)(uVar2 >> 2) & 0x3fffffff) + (int)uVar5 * 4) * uVar3 * 4 +
                         ((uint)uVar2 & 3 | (int)uVar7 * 4)) * 2);
            uVar2 = uVar2 + 1;
          } while (uVar2 != 0x10);
          uVar7 = uVar7 + 1;
          uVar6 = (ulong)((uint)uVar6 + 1);
        } while (uVar7 != uVar3);
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + (ulong)uVar3 * 0x10;
    } while (uVar5 != uVar1);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vepu541_h265_set_roi(void *dst_buf, void *src_buf, RK_S32 w, RK_S32 h)
{
    Vepu541RoiCfg *src = (Vepu541RoiCfg *)src_buf;
    Vepu541RoiCfg *dst = (Vepu541RoiCfg *)dst_buf;
    RK_S32 mb_w = MPP_ALIGN(w, 64) / 64;
    RK_S32 mb_h = MPP_ALIGN(h, 64) / 64;
    RK_S32 ctu_line = mb_w;
    RK_S32 i, j, cu16cnt;

    for (j = 0; j < mb_h; j++) {
        for ( i = 0; i < mb_w; i++) {
            RK_S32 ctu_addr = j * ctu_line + i;
            RK_S32 cu16_num_line = ctu_line * 4;
            for ( cu16cnt = 0; cu16cnt < 16; cu16cnt++) {
                RK_S32 cu16_x;
                RK_S32 cu16_y;
                RK_S32 cu16_addr_in_frame;
                cu16_x = cu16cnt & 3;
                cu16_y = cu16cnt / 4;
                cu16_x += i * 4;
                cu16_y += j * 4;
                cu16_addr_in_frame = cu16_x + cu16_y * cu16_num_line;
                dst[ctu_addr * 16 + cu16cnt] = src[cu16_addr_in_frame];
            }
        }
    }
    return MPP_OK;
}